

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O3

void __thiscall
VertexAttrib64Bit::Base::BuildProgramVSOnly
          (Base *this,GLuint program_id,GLchar *vertex_shader_code,GLuint *out_vertex_shader_id)

{
  GLuint GVar1;
  GLenum GVar2;
  
  GVar1 = (*(this->gl).createShader)(0x8b31);
  *out_vertex_shader_id = GVar1;
  GVar2 = (*(this->gl).getError)();
  glu::checkError(GVar2,"CreateShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x7e);
  CompileShader(this,*out_vertex_shader_id,vertex_shader_code);
  (*(this->gl).attachShader)(program_id,*out_vertex_shader_id);
  GVar2 = (*(this->gl).getError)();
  glu::checkError(GVar2,"AttachShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x83);
  LinkProgram(this,program_id);
  return;
}

Assistant:

void Base::BuildProgramVSOnly(GLuint program_id, const GLchar* vertex_shader_code, GLuint& out_vertex_shader_id) const
{
	out_vertex_shader_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

	CompileShader(out_vertex_shader_id, vertex_shader_code);

	gl.attachShader(program_id, out_vertex_shader_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "AttachShader");

	LinkProgram(program_id);
}